

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
deqp::egl::anon_unknown_0::getDamageRegion
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Frame *frame,int marginLeft,
          int marginBottom,int marginRight,int marginTop)

{
  pointer pDVar1;
  size_t drawNdx;
  ulong uVar2;
  long lVar3;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c = marginRight + marginLeft;
  local_40 = marginTop + marginBottom;
  lVar3 = 4;
  uVar2 = 0;
  local_38 = marginBottom;
  local_34 = marginLeft;
  while( true ) {
    pDVar1 = (frame->draws).
             super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(frame->draws).
                       super__Vector_base<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar1) / 0x18) <= uVar2)
    break;
    local_44 = *(int *)((long)(pDVar1->rect).bottomLeft.m_data + lVar3 + -4) - local_34;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_44);
    local_44 = *(int *)((long)(pDVar1->rect).bottomLeft.m_data + lVar3) - local_38;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_44);
    local_44 = (*(int *)((long)(pDVar1->rect).bottomLeft.m_data + lVar3 + 4) + local_3c) -
               *(int *)((long)(pDVar1->rect).bottomLeft.m_data + lVar3 + -4);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_44);
    local_44 = (*(int *)((long)(pDVar1->rect).topRight.m_data + lVar3) + local_40) -
               *(int *)((long)(pDVar1->rect).bottomLeft.m_data + lVar3);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_44);
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x18;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<EGLint> getDamageRegion (const Frame& frame, int marginLeft, int marginBottom, int marginRight, int marginTop)
{
	vector<EGLint> damageRegion;
	for (size_t drawNdx = 0; drawNdx < frame.draws.size(); drawNdx++)
	{
		const ColoredRect& rect = frame.draws[drawNdx].rect;
		damageRegion.push_back(rect.bottomLeft.x() - marginLeft);
		damageRegion.push_back(rect.bottomLeft.y() - marginBottom);
		damageRegion.push_back(rect.topRight.x() - rect.bottomLeft.x() + marginLeft + marginRight);
		damageRegion.push_back(rect.topRight.y() - rect.bottomLeft.y() + marginBottom + marginTop);
	}

	DE_ASSERT(damageRegion.size() % 4 == 0);
	return damageRegion;
}